

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O3

RK_S32 util_check_stride_by_pixel
                 (RK_S32 workaround,RK_S32 width,RK_S32 hor_stride,RK_S32 pixel_size)

{
  if (workaround != 0) {
    return 1;
  }
  if (hor_stride < pixel_size * width) {
    _mpp_log_l(4,"utils",
               "warning: stride by bytes %d is smarller than width %d mutiple by pixel size %d\n",0,
               hor_stride,width,pixel_size);
    _mpp_log_l(4,"utils","multiple stride %d by pixel size %d and set new byte stride to %d\n",0,
               hor_stride,pixel_size,pixel_size * hor_stride);
  }
  return (uint)(hor_stride < pixel_size * width);
}

Assistant:

static RK_S32 util_check_stride_by_pixel(RK_S32 workaround, RK_S32 width,
                                         RK_S32 hor_stride, RK_S32 pixel_size)
{
    if (!workaround && hor_stride < width * pixel_size) {
        mpp_log("warning: stride by bytes %d is smarller than width %d mutiple by pixel size %d\n",
                hor_stride, width, pixel_size);
        mpp_log("multiple stride %d by pixel size %d and set new byte stride to %d\n",
                hor_stride, pixel_size, hor_stride * pixel_size);
        workaround = 1;
    }

    return workaround;
}